

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O1

void * __thiscall LLVMBC::LLVMContext::allocate(LLVMContext *this,size_t size,size_t align)

{
  void *ret;
  void *pvVar1;
  void *ret_1;
  
  pvVar1 = (void *)(this->current_block + (align - 1) & -align);
  this->current_block = (uintptr_t)pvVar1;
  if (this->current_block_end < (long)pvVar1 + size) {
    this->current_block = 0;
    this->current_block_end = 0;
    pvVar1 = (void *)0x0;
  }
  else {
    this->current_block = (long)pvVar1 + size;
  }
  if (pvVar1 == (void *)0x0) {
    allocate_new_chain(this,size,align);
    pvVar1 = (void *)((align - 1) + this->current_block & -align);
    this->current_block = (uintptr_t)pvVar1;
    if (this->current_block_end < size + (long)pvVar1) {
      this->current_block = 0;
      this->current_block_end = 0;
      pvVar1 = (void *)0x0;
    }
    else {
      this->current_block = size + (long)pvVar1;
    }
  }
  return pvVar1;
}

Assistant:

void *LLVMContext::allocate(size_t size, size_t align)
{
	void *ptr = allocate_from_chain(size, align);
	if (!ptr)
	{
		allocate_new_chain(size, align);
		ptr = allocate_from_chain(size, align);
	}
	return ptr;
}